

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O3

void __thiscall QEvdevTabletHandler::readData(QEvdevTabletHandler *this)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  input_event *ev;
  long in_FS_OFFSET;
  input_event buffer [32];
  input_event local_338 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ev = local_338;
  memset(ev,0xaa,0x300);
  uVar6 = 0;
LAB_00108731:
  do {
    iVar1 = this->m_fd;
    do {
      sVar2 = read(iVar1,(void *)((long)&local_338[0].time.tv_sec + uVar6),0x300 - uVar6);
      if (sVar2 != -1) {
        iVar1 = (int)sVar2;
        if (iVar1 == 0) {
          readData(this);
          goto LAB_001087df;
        }
        if (-1 < iVar1) {
          uVar5 = (int)uVar6 + iVar1;
          uVar6 = (ulong)uVar5;
          if (0xaaaaaaa < (uVar5 * -0x55555555 >> 3 | uVar5 * 0x60000000)) goto LAB_00108731;
          if (0x17 < uVar5) {
            uVar6 = (ulong)(uVar5 / 0x18);
            do {
              QEvdevTabletData::processInputEvent(this->d,ev);
              ev = ev + 1;
              uVar6 = uVar6 - 1;
            } while (uVar6 != 0);
          }
          goto LAB_001087df;
        }
        piVar3 = __errno_location();
        iVar4 = *piVar3;
        break;
      }
      piVar3 = __errno_location();
      iVar4 = *piVar3;
    } while (iVar4 == 4);
    if ((iVar4 != 4) && (iVar4 != 0xb)) {
      readData();
LAB_001087df:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

void QEvdevTabletHandler::readData()
{
    input_event buffer[32];
    int n = 0;
    for (; ;) {
        int result = QT_READ(m_fd, reinterpret_cast<char*>(buffer) + n, sizeof(buffer) - n);
        if (!result) {
            qWarning("evdevtablet: %ls: Got EOF from input device", qUtf16Printable(m_device));
            return;
        } else if (result < 0) {
            if (errno != EINTR && errno != EAGAIN) {
                qErrnoWarning("evdevtablet: %ls: Could not read from input device", qUtf16Printable(m_device));
                if (errno == ENODEV) { // device got disconnected -> stop reading
                    delete m_notifier;
                    m_notifier = 0;
                    QT_CLOSE(m_fd);
                    m_fd = -1;
                }
                return;
            }
        } else {
            n += result;
            if (n % sizeof(input_event) == 0)
                break;
        }
    }

    n /= sizeof(input_event);

    for (int i = 0; i < n; ++i)
        d->processInputEvent(&buffer[i]);
}